

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O2

int __thiscall cpp_db::sqlite_result::get_column_index(sqlite_result *this,string *column_name)

{
  const_iterator cVar1;
  ostream *poVar2;
  db_exception *this_00;
  string local_1c0;
  stringstream message;
  ostream local_190;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->column_names)._M_h,column_name);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(int *)((long)cVar1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 0x28);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&message);
  poVar2 = std::operator<<(&local_190,"Column \'");
  poVar2 = std::operator<<(poVar2,(string *)column_name);
  std::operator<<(poVar2,"\' not found!");
  this_00 = (db_exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  db_exception::db_exception(this_00,&local_1c0);
  __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int sqlite_result::get_column_index(const std::string &column_name) const
{
    auto pos = column_names.find(column_name);
    if (pos != column_names.end())
        return pos->second;
    std::stringstream message;
    message << "Column '" << column_name << "' not found!";
    throw db_exception(message.str());
}